

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::update_current(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *this,size_t pos)

{
  size_t sVar1;
  size_t sVar2;
  long __n;
  iterator_type i_00;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_RSI;
  boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_RDI;
  base_iterator i;
  ptrdiff_t diff;
  boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  sVar1 = get_offset(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  sVar2 = get_offset(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  __n = sVar1 - sVar2;
  i_00 = boundary_point<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         ::iterator(&in_RDI->value_);
  std::advance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,long>(in_RSI,__n);
  in_RDI->current_ = (size_t)in_RSI;
  boundary_point<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::iterator(&in_RDI->value_,i_00);
  update_rule(in_RDI);
  return;
}

Assistant:

void update_current(size_t pos)
                    {
                        std::ptrdiff_t diff = get_offset(pos) - get_offset(current_);
                        base_iterator i=value_.iterator();
                        std::advance(i,diff);
                        current_ = pos;
                        value_.iterator(i);
                        update_rule();
                    }